

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void mark_as_moved(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn,
                  bitmap_t loop_invariant_bb_insn_bitmap,bitmap_t bb_insns_to_move_bitmap)

{
  uint uVar1;
  uint uVar2;
  VARR_bb_insn_t *pVVar3;
  bb_insn_t_conflict pbVar4;
  MIR_insn_t_conflict insn;
  void *pvVar5;
  c2mir_ctx *pcVar6;
  MIR_insn_t pMVar7;
  gen_ctx *before;
  MIR_insn_t pMVar8;
  bool bVar9;
  gen_ctx_t pgVar10;
  int iVar11;
  bb_insn_t_conflict *ppbVar12;
  ulong uVar13;
  ulong uVar14;
  bb_insn_t insn_00;
  ulong uVar15;
  MIR_context_t before_00;
  bb_insn_t_conflict pbVar16;
  MIR_func_t bb_insn_00;
  gen_ctx_t gen_ctx_00;
  ulong in_R9;
  size_t sVar17;
  int local_4c;
  bitmap_t local_48;
  bb_insn_t_conflict local_40;
  MIR_op_t *local_38;
  
  pVVar3 = gen_ctx->temp_bb_insns2;
  if ((pVVar3 != (VARR_bb_insn_t *)0x0) &&
     (gen_ctx_00 = (gen_ctx_t)pVVar3->varr, gen_ctx_00 != (gen_ctx_t)0x0)) {
    pVVar3->els_num = 0;
    before_00 = (MIR_context_t)bb_insn;
    if (pVVar3->size == 0) {
      before_00 = (MIR_context_t)0x8;
      ppbVar12 = (bb_insn_t_conflict *)realloc(gen_ctx_00,8);
      pVVar3->varr = ppbVar12;
      pVVar3->size = 1;
    }
    sVar17 = pVVar3->els_num;
    pVVar3->els_num = sVar17 + 1;
    pVVar3->varr[sVar17] = bb_insn;
    if (loop_invariant_bb_insn_bitmap == (bitmap_t)0x0) {
      mark_as_moved_cold_5();
      if ((gen_ctx_00 == (gen_ctx_t)0x0) || (before_00 == (MIR_context_t)0x0)) {
        DLIST_MIR_insn_t_remove_cold_1();
LAB_0016b413:
        DLIST_MIR_insn_t_remove_cold_2();
      }
      else {
        pcVar6 = before_00->c2mir_ctx;
        if (pcVar6 == (c2mir_ctx *)0x0) {
          if (gen_ctx_00->ctx != before_00) goto LAB_0016b413;
          gen_ctx_00->ctx = (MIR_context_t)before_00->error_func;
        }
        else {
          *(MIR_error_func_t *)(pcVar6 + 0x10) = before_00->error_func;
        }
        pgVar10 = (gen_ctx_t)before_00->error_func;
        if (((gen_ctx_t)before_00->error_func != (gen_ctx_t)0x0) ||
           (pgVar10 = gen_ctx_00, *(MIR_context_t *)&gen_ctx_00->optimize_level == before_00)) {
          *(c2mir_ctx **)&pgVar10->optimize_level = pcVar6;
          before_00->c2mir_ctx = (c2mir_ctx *)0x0;
          before_00->error_func = (MIR_error_func_t)0x0;
          return;
        }
      }
      DLIST_MIR_insn_t_remove_cold_3();
      pbVar4 = (bb_insn_t_conflict)insn_00->insn;
      pMVar7 = ((DLIST_LINK_MIR_insn_t *)&insn_00->gvn_val_const_p)->prev;
      before = before_00->gen_ctx;
      bb_insn_00 = (gen_ctx_00->curr_func_item->u).func;
      if (pMVar7 == (MIR_insn_t)0x0) {
        if ((bb_insn_t)(bb_insn_00->insns).head != insn_00) {
          gen_move_insn_before_cold_1();
          goto LAB_0016b4c8;
        }
        (bb_insn_00->insns).head = *(MIR_insn_t *)&insn_00->mem_index;
      }
      else {
        (pMVar7->insn_link).next = *(MIR_insn_t *)&insn_00->mem_index;
      }
      pMVar8 = *(MIR_insn_t *)&insn_00->mem_index;
      if (pMVar8 == (MIR_insn_t)0x0) {
        if (((DLIST_LINK_bb_insn_t *)&(bb_insn_00->insns).tail)->prev != insn_00) {
LAB_0016b4c8:
          gen_move_insn_before_cold_2();
          iVar11 = ssa_dead_insn_p(gen_ctx_00,(bb_insn_t_conflict)bb_insn_00);
          if (iVar11 != 0) {
            if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) && (1 < gen_ctx_00->debug_level)) {
              fwrite("  deleting now dead insn ",0x19,1,(FILE *)gen_ctx_00->debug_file);
              print_bb_insn(gen_ctx_00,(bb_insn_t_conflict)bb_insn_00,0);
            }
            pMVar7 = (MIR_insn_t)bb_insn_00->name;
            remove_insn_ssa_edges(pMVar7);
            gen_delete_insn(gen_ctx_00,pMVar7);
          }
          return;
        }
        pMVar8 = (MIR_insn_t)&bb_insn_00->insns;
      }
      (pMVar8->insn_link).prev = pMVar7;
      ((DLIST_LINK_MIR_insn_t *)&insn_00->gvn_val_const_p)->prev = (MIR_insn_t)0x0;
      *(MIR_insn_t *)&insn_00->mem_index = (MIR_insn_t)0x0;
      MIR_insert_insn_before
                (gen_ctx_00->ctx,gen_ctx_00->curr_func_item,(MIR_insn_t_conflict)before_00,
                 (MIR_insn_t_conflict)insn_00);
      DLIST_bb_insn_t_remove(&pbVar4->bb->bb_insns,pbVar4);
      DLIST_bb_insn_t_insert_before
                (&(*(bb_t_conflict *)&before->addr_insn_p)->bb_insns,(bb_insn_t_conflict)before,
                 pbVar4);
      pbVar4->bb = *(bb_t_conflict *)&before->addr_insn_p;
      return;
    }
    uVar1 = bb_insn->index;
    if ((loop_invariant_bb_insn_bitmap->els_num << 6 <= (ulong)uVar1) ||
       ((loop_invariant_bb_insn_bitmap->varr[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0))
    goto LAB_0016b393;
    pVVar3 = gen_ctx->temp_bb_insns2;
    while( true ) {
      if (pVVar3 == (VARR_bb_insn_t *)0x0) {
        mark_as_moved_cold_4();
        return;
      }
      sVar17 = pVVar3->els_num;
      if (sVar17 == 0) {
        return;
      }
      local_48 = bb_insns_to_move_bitmap;
      if (pVVar3->varr == (bb_insn_t_conflict *)0x0) break;
      pVVar3->els_num = sVar17 - 1;
      pbVar4 = pVVar3->varr[sVar17 - 1];
      uVar1 = pbVar4->index;
      bitmap_expand(bb_insns_to_move_bitmap,(ulong)uVar1 + 1);
      if (bb_insns_to_move_bitmap == (bitmap_t)0x0) goto LAB_0016b389;
      bb_insns_to_move_bitmap->varr[uVar1 >> 6] =
           bb_insns_to_move_bitmap->varr[uVar1 >> 6] | 1L << ((ulong)uVar1 & 0x3f);
      insn = pbVar4->insn;
      uVar1 = *(uint *)&insn->field_0x1c;
      local_38 = insn->ops;
      uVar14 = 0;
      uVar15 = 0;
      in_R9 = in_R9 & 0xffffffff;
LAB_0016b1c5:
      bVar9 = true;
      if (uVar14 < uVar1) {
        do {
          uVar13 = uVar14;
          MIR_insn_op_mode(gen_ctx->ctx,insn,uVar13,&local_4c);
          if ((local_4c == 0) || (local_38[uVar13].field_0x8 == '\v')) {
            if (uVar15 < 2) {
              uVar14 = uVar15;
              do {
                if (local_38[uVar13].field_0x8 != '\v') {
                  if (uVar15 != 1) {
                    uVar14 = uVar15;
                    uVar15 = 0;
                    if (local_38[uVar13].field_0x8 != '\x02') goto LAB_0016b257;
LAB_0016b26f:
                    uVar15 = uVar14 + 1;
                    bVar9 = false;
                    uVar14 = uVar13;
                    goto LAB_0016b27b;
                  }
                  break;
                }
                if (*(int *)((long)&local_38[uVar13].u + (ulong)(uVar14 != 0) * 4 + 0x10) != -1)
                goto LAB_0016b26f;
                uVar14 = uVar14 + 1;
              } while (uVar14 == 1);
            }
            uVar15 = 0;
          }
LAB_0016b257:
          uVar14 = uVar13 + 1;
        } while (uVar14 != uVar1);
LAB_0016b27b:
        in_R9 = uVar13 & 0xffffffff;
      }
      if (!bVar9) {
        pvVar5 = pbVar4->insn->ops[(int)in_R9].data;
        if (pvVar5 != (void *)0x0) {
          uVar2 = pbVar4->index;
          if (((ulong)uVar2 < loop_invariant_bb_insn_bitmap->els_num << 6) &&
             ((loop_invariant_bb_insn_bitmap->varr[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0))
          {
            pVVar3 = gen_ctx->temp_bb_insns2;
            if (pVVar3->varr == (bb_insn_t_conflict *)0x0) {
              mark_as_moved_cold_1();
              break;
            }
            pbVar16 = *(bb_insn_t_conflict *)((long)pvVar5 + 8);
            uVar13 = pVVar3->els_num + 1;
            if (pVVar3->size < uVar13) {
              sVar17 = (uVar13 >> 1) + uVar13;
              local_40 = pbVar16;
              ppbVar12 = (bb_insn_t_conflict *)realloc(pVVar3->varr,sVar17 * 8);
              pVVar3->varr = ppbVar12;
              pVVar3->size = sVar17;
              pbVar16 = local_40;
            }
            sVar17 = pVVar3->els_num;
            pVVar3->els_num = sVar17 + 1;
            pVVar3->varr[sVar17] = pbVar16;
          }
        }
        goto LAB_0016b1c5;
      }
      pVVar3 = gen_ctx->temp_bb_insns2;
      bb_insns_to_move_bitmap = local_48;
    }
    mark_as_moved_cold_3();
LAB_0016b389:
    mark_as_moved_cold_2();
  }
  mark_as_moved_cold_6();
LAB_0016b393:
  __assert_fail("bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x14e9,"void mark_as_moved(gen_ctx_t, bb_insn_t, bitmap_t, bitmap_t)");
}

Assistant:

static void mark_as_moved (gen_ctx_t gen_ctx, bb_insn_t bb_insn,
                           bitmap_t loop_invariant_bb_insn_bitmap,
                           bitmap_t bb_insns_to_move_bitmap) {
  int op_num;
  MIR_reg_t var;
  insn_var_iterator_t iter;
  ssa_edge_t se;

  VARR_TRUNC (bb_insn_t, temp_bb_insns2, 0);
  VARR_PUSH (bb_insn_t, temp_bb_insns2, bb_insn);
  gen_assert (bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index));
  while (VARR_LENGTH (bb_insn_t, temp_bb_insns2) != 0) {
    bb_insn = VARR_POP (bb_insn_t, temp_bb_insns2);
    bitmap_set_bit_p (bb_insns_to_move_bitmap, bb_insn->index);
    FOREACH_IN_INSN_VAR (gen_ctx, iter, bb_insn->insn, var, op_num)
    if ((se = bb_insn->insn->ops[op_num].data) != NULL
        && bitmap_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index))
      VARR_PUSH (bb_insn_t, temp_bb_insns2, se->def);
  }
}